

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O0

void __thiscall
itlib::small_vector<double,_4UL,_0UL,_std::allocator<double>_>::assign_impl
          (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this,size_type count,
          double *value)

{
  double *pdVar1;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RDX;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RSI;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *in_RDI;
  size_type i;
  size_t in_stack_ffffffffffffffe0;
  small_vector<double,_4UL,_0UL,_std::allocator<double>_> *this_00;
  
  pdVar1 = choose_data(in_RDX,in_stack_ffffffffffffffe0);
  in_RDI->m_end = pdVar1;
  in_RDI->m_begin = pdVar1;
  for (this_00 = (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)0x0; this_00 < in_RSI;
      this_00 = (small_vector<double,_4UL,_0UL,_std::allocator<double>_> *)&this_00->field_0x1) {
    get_alloc(in_RDI);
    std::allocator_traits<std::allocator<double>>::construct<double,double_const&>
              ((allocator_type *)this_00,(double *)in_RDI,(double *)0x1f3358);
    in_RDI->m_end = in_RDI->m_end + 1;
  }
  update_capacity(this_00);
  return;
}

Assistant:

void assign_impl(size_type count, const T& value)
    {
        assert(m_begin);
        assert(m_begin == m_end);

        m_begin = m_end = choose_data(count);
        for (size_type i = 0; i < count; ++i)
        {
            atraits::construct(get_alloc(), m_end, value);
            ++m_end;
        }

        update_capacity();
    }